

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O2

DdNode * Abc_NtkSparsifyInternalOne(DdManager *ddNew,DdNode *bFunc,int nFanins,int nPerc)

{
  uint uVar1;
  DdNode **pbCubes;
  DdNode *n;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  dVar4 = Cudd_CountMinterm(ddNew,bFunc,nFanins);
  uVar1 = (uint)((double)(int)dVar4 * (double)nPerc * 0.01);
  uVar3 = 1;
  if (1 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  pbCubes = Cudd_bddPickArbitraryMinterms(ddNew,bFunc,ddNew->vars,nFanins,(int)uVar3);
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    Cudd_Ref(pbCubes[uVar2]);
  }
  n = Extra_bddComputeSum(ddNew,pbCubes,(int)uVar3);
  Cudd_Ref(n);
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    Cudd_RecursiveDeref(ddNew,pbCubes[uVar2]);
  }
  Cudd_Deref(n);
  free(pbCubes);
  return n;
}

Assistant:

DdNode * Abc_NtkSparsifyInternalOne( DdManager * ddNew, DdNode * bFunc, int nFanins, int nPerc )
{
    int nSpace = (int)Cudd_CountMinterm( ddNew, bFunc, nFanins );
    int i, nMints = Abc_MaxInt( 1, (int)(0.01 * nPerc * nSpace) );
    DdNode ** pbMints = Cudd_bddPickArbitraryMinterms( ddNew, bFunc, ddNew->vars, nFanins, nMints );
    DdNode * bRes;
    for ( i = 0; i < nMints; i++ )
        Cudd_Ref( pbMints[i] );
    bRes = Extra_bddComputeSum( ddNew, pbMints, nMints ); Cudd_Ref( bRes );
    for ( i = 0; i < nMints; i++ )
        Cudd_RecursiveDeref( ddNew, pbMints[i] );
    Cudd_Deref( bRes );
    ABC_FREE( pbMints );
    return bRes;
}